

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::FunctionPointerPrinter::
     PrintValue<void(unsigned_short_const*,int,unsigned_short*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*,int),void>
               (_func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_InterpFilterParams_ptr_InterpFilterParams_ptr_int_int_int_int_ConvolveParams_ptr_int
                *p,ostream *os)

{
  ostream *in_RSI;
  void *in_RDI;
  
  if (in_RDI == (void *)0x0) {
    std::operator<<(in_RSI,"NULL");
  }
  else {
    std::ostream::operator<<(in_RSI,in_RDI);
  }
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is a function type, so '*os << p' doesn't do what we want
      // (it just prints p as bool).  We want to print p as a const
      // void*.
      *os << reinterpret_cast<const void*>(p);
    }
  }